

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  string_t left_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  string_t *psVar4;
  int *piVar5;
  int *piVar6;
  byte in_CL;
  Vector *in_RDX;
  undefined8 in_RDI;
  Vector *unaff_retaddr;
  int *result_data;
  int *rdata;
  string_t *ldata;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar7;
  ValidityMask *mask;
  undefined8 uVar8;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
             (VectorType)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  psVar4 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x1eafc94);
  piVar5 = ConstantVector::GetData<int>((Vector *)0x1eafca3);
  piVar6 = ConstantVector::GetData<int>((Vector *)0x1eafcb2);
  bVar2 = ConstantVector::IsNull((Vector *)0x1eafcc1);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x1eafccf), !bVar2)) {
    uVar7 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
    mask = *(ValidityMask **)&psVar4->value;
    uVar8 = *(undefined8 *)((long)&psVar4->value + 8);
    iVar3 = *piVar5;
    ConstantVector::Validity(in_RDX);
    left_00.value.pointer.ptr = (char *)piVar5;
    left_00.value._0_8_ = piVar6;
    iVar3 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::GetBitOperator,duckdb::string_t,int,int>
                      (SUB81((ulong)uVar8 >> 0x38,0),left_00,(int)uVar8,mask,CONCAT44(uVar7,iVar3));
    *piVar6 = iVar3;
    return;
  }
  ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}